

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
nlohmann::detail::
iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
::iteration_proxy_value
          (iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *this,iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *it)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer pbVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *ppVar4;
  difference_type dVar5;
  
  pbVar3 = it->m_object;
  ppVar4 = (it->m_it).object_iterator._M_current;
  uVar1 = *(undefined4 *)((long)&(it->m_it).array_iterator._M_current + 4);
  dVar5 = (it->m_it).primitive_iterator.m_it;
  uVar2 = *(undefined4 *)((long)&(it->m_it).primitive_iterator.m_it + 4);
  *(undefined4 *)&(this->anchor).m_it.array_iterator._M_current =
       *(undefined4 *)&(it->m_it).array_iterator._M_current;
  *(undefined4 *)((long)&(this->anchor).m_it.array_iterator._M_current + 4) = uVar1;
  *(int *)&(this->anchor).m_it.primitive_iterator.m_it = (int)dVar5;
  *(undefined4 *)((long)&(this->anchor).m_it.primitive_iterator.m_it + 4) = uVar2;
  (this->anchor).m_object = pbVar3;
  (this->anchor).m_it.object_iterator._M_current = ppVar4;
  this->array_index = 0;
  this->array_index_last = 0;
  (this->array_index_str)._M_dataplus._M_p = (pointer)&(this->array_index_str).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->array_index_str,"0","");
  (this->empty_str)._M_dataplus._M_p = (pointer)&(this->empty_str).field_2;
  (this->empty_str)._M_string_length = 0;
  (this->empty_str).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit iteration_proxy_value(IteratorType it) noexcept
        : anchor(std::move(it))
    {}